

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_fold.c
# Opt level: O0

void printhash(BuildCtx *ctx,uint32_t *htab,uint32_t sz)

{
  uint local_20;
  uint32_t i;
  uint32_t sz_local;
  uint32_t *htab_local;
  BuildCtx *ctx_local;
  
  fprintf((FILE *)ctx->fp,"static const uint32_t fold_hash[%d] = {\n0x%08x",(ulong)(sz + 1),
          (ulong)*htab);
  for (local_20 = 1; local_20 < sz + 1; local_20 = local_20 + 1) {
    fprintf((FILE *)ctx->fp,",\n0x%08x",(ulong)htab[local_20]);
  }
  fprintf((FILE *)ctx->fp,"\n};\n\n");
  return;
}

Assistant:

static void printhash(BuildCtx *ctx, uint32_t *htab, uint32_t sz)
{
  uint32_t i;
  fprintf(ctx->fp, "static const uint32_t fold_hash[%d] = {\n0x%08x",
	  sz+1, htab[0]);
  for (i = 1; i < sz+1; i++)
    fprintf(ctx->fp, ",\n0x%08x", htab[i]);
  fprintf(ctx->fp, "\n};\n\n");
}